

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O3

void __thiscall
chrono::ChFrameMoving<double>::SetPos_dt(ChFrameMoving<double> *this,ChVector<double> *mvel)

{
  if (&this->coord_dt != (ChCoordsys<double> *)mvel) {
    (this->coord_dt).pos.m_data[0] = mvel->m_data[0];
    (this->coord_dt).pos.m_data[1] = mvel->m_data[1];
    (this->coord_dt).pos.m_data[2] = mvel->m_data[2];
  }
  return;
}

Assistant:

virtual void SetPos_dt(const ChVector<Real>& mvel) { coord_dt.pos = mvel; }